

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

axbStatus_t check_equal_csr(axbMat_s *A,axbMat_s *B,char *test_desc)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  axbStatus_t aVar1;
  void *pvVar2;
  void *values;
  size_t sVar3;
  char *__format;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  size_t A_nnz;
  size_t A_rows;
  size_t B_nnz;
  size_t B_rows;
  size_t B_cols;
  size_t A_cols;
  size_t local_88;
  size_t local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  aVar1 = axbMatGetSizes(A,&local_80,&local_38);
  if (aVar1 == 0) {
    aVar1 = axbMatGetNonzerosSize(A,&local_88);
    if (aVar1 == 0) {
      aVar1 = axbMatGetSizes(B,&local_48,&local_40);
      if (aVar1 == 0) {
        aVar1 = axbMatGetNonzerosSize(B,&local_50);
        if (aVar1 == 0) {
          pvVar2 = malloc(local_80 * 4 + 4);
          sVar3 = local_88;
          local_58 = malloc(local_88 * 4);
          local_68 = malloc(sVar3 << 3);
          __ptr_02 = local_58;
          local_60 = pvVar2;
          aVar1 = axbMatGetValuesCSR(A,pvVar2,AXB_INT_32,local_58,AXB_INT_32,local_68,
                                     AXB_REAL_DOUBLE);
          if (aVar1 == 0) {
            local_70 = malloc(local_48 * 4 + 4);
            pvVar2 = malloc(local_50 * 4);
            values = malloc(local_50 << 3);
            __ptr = local_70;
            local_78 = pvVar2;
            aVar1 = axbMatGetValuesCSR(B,local_70,AXB_INT_32,pvVar2,AXB_INT_32,values,
                                       AXB_REAL_DOUBLE);
            __ptr_01 = local_60;
            __ptr_00 = local_68;
            pvVar2 = local_78;
            if (aVar1 == 0) {
              if (local_80 != 0) {
                sVar3 = 0;
                do {
                  dVar5 = (double)*(int *)((long)local_60 + sVar3 * 4);
                  dVar7 = (double)*(int *)((long)__ptr + sVar3 * 4);
                  dVar4 = dVar5 - dVar7;
                  dVar6 = 1.0;
                  if (dVar4 != 0.0) {
                    dVar6 = ABS(dVar5);
                    dVar7 = ABS(dVar7);
                    if (dVar6 <= dVar7) {
                      dVar6 = dVar7;
                    }
                  }
                  if (1e-13 < dVar4 / dVar6) {
                    __format = 
                    "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
                    ;
                    goto LAB_00105a64;
                  }
                  sVar3 = sVar3 + 1;
                } while (local_80 != sVar3);
              }
              if (local_88 != 0) {
                sVar3 = 0;
                do {
                  dVar5 = (double)*(int *)((long)__ptr_02 + sVar3 * 4);
                  dVar7 = (double)*(int *)((long)local_78 + sVar3 * 4);
                  dVar4 = dVar5 - dVar7;
                  dVar6 = 1.0;
                  if (dVar4 != 0.0) {
                    dVar6 = ABS(dVar5);
                    dVar7 = ABS(dVar7);
                    if (dVar6 <= dVar7) {
                      dVar6 = dVar7;
                    }
                  }
                  if (1e-13 < dVar4 / dVar6) {
                    __format = 
                    "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
                    ;
LAB_00105a64:
                    fprintf(_stderr,__format,test_desc);
LAB_00105a8b:
                    exit(1);
                  }
                  dVar6 = *(double *)((long)local_68 + sVar3 * 8);
                  dVar4 = *(double *)((long)values + sVar3 * 8);
                  dVar5 = dVar6 - dVar4;
                  if (dVar5 != 0.0) {
                    dVar6 = ABS(dVar6);
                    dVar4 = ABS(dVar4);
                    if (dVar6 <= dVar4) {
                      dVar6 = dVar4;
                    }
                    dVar5 = dVar5 / dVar6;
                  }
                  if (1e-13 < dVar5) {
                    fprintf(_stderr,
                            "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n"
                            ,test_desc);
                    goto LAB_00105a8b;
                  }
                  sVar3 = sVar3 + 1;
                } while (local_88 != sVar3);
              }
              aVar1 = 0;
              printf("PASSED: Test %s\n",test_desc);
              free(__ptr_01);
              free(__ptr_02);
              free(__ptr_00);
              free(__ptr);
              free(pvVar2);
              free(values);
            }
            else {
              check_equal_csr_cold_6();
            }
          }
          else {
            check_equal_csr_cold_5();
          }
        }
        else {
          check_equal_csr_cold_4();
        }
      }
      else {
        check_equal_csr_cold_3();
      }
    }
    else {
      check_equal_csr_cold_2();
    }
  }
  else {
    check_equal_csr_cold_1();
  }
  return aVar1;
}

Assistant:

axbStatus_t check_equal_csr(const struct axbMat_s *A, const struct axbMat_s *B, const char *test_desc)
{
  //
  // Check 1: Dimensions
  //
  size_t A_rows, A_cols, A_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(A, &A_rows, &A_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(A, &A_nnz));

  size_t B_rows, B_cols, B_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(B, &B_rows, &B_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(B, &B_nnz));

  //
  // Check 2: Values
  //
  int *A_row_markers = malloc(sizeof(int)*(A_rows+1));
  int *A_col_indices = malloc(sizeof(int)*A_nnz);
  double *A_values   = malloc(sizeof(double)*A_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(A, A_row_markers, AXB_INT_32, A_col_indices, AXB_INT_32, A_values, AXB_REAL_DOUBLE));


  int *B_row_markers = malloc(sizeof(int)*(B_rows+1));
  int *B_col_indices = malloc(sizeof(int)*B_nnz);
  double *B_values   = malloc(sizeof(double)*B_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(B, B_row_markers, AXB_INT_32, B_col_indices, AXB_INT_32, B_values, AXB_REAL_DOUBLE));


  // test row array:
  for (size_t i=0; i<A_rows; ++i) {
    double rel_diff = get_rel_diff(A_row_markers[i], B_row_markers[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_row_markers[i], B_row_markers[i]);
      exit(EXIT_FAILURE);
    }
  }

  // test col indices and values arrays:
  for (size_t i=0; i<A_nnz; ++i) {
    double rel_diff = get_rel_diff(A_col_indices[i], B_col_indices[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_col_indices[i], B_col_indices[i]);
      exit(EXIT_FAILURE);
    }

    rel_diff = get_rel_diff(A_values[i], B_values[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n", test_desc, rel_diff, A_values[i], B_values[i]);
      exit(EXIT_FAILURE);
    }

  }


  printf("PASSED: Test %s\n", test_desc);

  free(A_row_markers);
  free(A_col_indices);
  free(A_values);
  free(B_row_markers);
  free(B_col_indices);
  free(B_values);
  return 0;
}